

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_feature_merger.cc
# Opt level: O0

void VW::shared_feature_merger::predict_or_learn<false>
               (sfm_data *param_1,multi_learner *base,multi_ex *ec_seq)

{
  const_iterator __position;
  byte bVar1;
  bool bVar2;
  size_type sVar3;
  undefined8 uVar4;
  reference ppeVar5;
  example *in_RDX;
  example **example_1;
  iterator __end3_1;
  iterator __begin3_1;
  multi_ex *__range3_1;
  example **example;
  iterator __end3;
  iterator __begin3;
  multi_ex *__range3;
  bool has_example_header;
  value_type shared_example;
  stringstream __msg;
  vector<example_*,_std::allocator<example_*>_> *in_stack_fffffffffffffd88;
  polyprediction *__a;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
  *in_stack_fffffffffffffd90;
  example *in_stack_fffffffffffffd98;
  example *in_stack_fffffffffffffda0;
  const_iterator in_stack_fffffffffffffda8;
  example *in_stack_fffffffffffffdb0;
  int plineNumber;
  char *in_stack_fffffffffffffdb8;
  vw_exception *in_stack_fffffffffffffdc0;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_230;
  example *local_228;
  reference local_220;
  example **local_218;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_210;
  example *local_208;
  example **local_200;
  example **local_1f8;
  undefined7 in_stack_fffffffffffffe18;
  value_type this;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  stringstream local_1a0 [16];
  ostream local_190;
  example *local_18;
  
  local_18 = in_RDX;
  sVar3 = std::vector<example_*,_std::allocator<example_*>_>::size
                    ((vector<example_*,_std::allocator<example_*>_> *)in_RDX);
  if (sVar3 != 0) {
    this = (value_type)0x0;
    std::vector<example_*,_std::allocator<example_*>_>::operator[]
              ((vector<example_*,_std::allocator<example_*>_> *)local_18,0);
    bVar1 = CB::ec_is_example_header((example *)in_stack_fffffffffffffda8._M_current);
    if ((bool)bVar1) {
      ppeVar5 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                          ((vector<example_*,_std::allocator<example_*>_> *)local_18,0);
      this = *ppeVar5;
      in_stack_fffffffffffffd98 = local_18;
      local_1f8 = (example **)
                  std::vector<example_*,_std::allocator<example_*>_>::begin
                            (in_stack_fffffffffffffd88);
      __gnu_cxx::__normal_iterator<example*const*,std::vector<example*,std::allocator<example*>>>::
      __normal_iterator<example**>
                ((__normal_iterator<example_*const_*,_std::vector<example_*,_std::allocator<example_*>_>_>
                  *)in_stack_fffffffffffffd90,
                 (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                  *)in_stack_fffffffffffffd88);
      local_200 = (example **)
                  std::vector<example_*,_std::allocator<example_*>_>::erase
                            ((vector<example_*,_std::allocator<example_*>_> *)
                             in_stack_fffffffffffffda0,in_stack_fffffffffffffda8);
      local_208 = local_18;
      local_210._M_current =
           (example **)
           std::vector<example_*,_std::allocator<example_*>_>::begin(in_stack_fffffffffffffd88);
      local_218 = (example **)
                  std::vector<example_*,_std::allocator<example_*>_>::end(in_stack_fffffffffffffd88)
      ;
      while (bVar2 = __gnu_cxx::operator!=
                               (in_stack_fffffffffffffd90,
                                (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                 *)in_stack_fffffffffffffd88), bVar2) {
        local_220 = __gnu_cxx::
                    __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                    ::operator*(&local_210);
        LabelDict::add_example_namespaces_from_example
                  (in_stack_fffffffffffffdb0,(example *)in_stack_fffffffffffffda8._M_current);
        __gnu_cxx::
        __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
        operator++(&local_210);
      }
      ppeVar5 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                          ((vector<example_*,_std::allocator<example_*>_> *)local_18,0);
      std::swap<polyprediction>(&(*ppeVar5)->pred,&this->pred);
    }
    sVar3 = std::vector<example_*,_std::allocator<example_*>_>::size
                      ((vector<example_*,_std::allocator<example_*>_> *)local_18);
    if ((sVar3 != 0) &&
       (LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::predict
                  ((learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *)
                   in_stack_fffffffffffffda0,
                   (vector<example_*,_std::allocator<example_*>_> *)in_stack_fffffffffffffd98,
                   (size_t)in_stack_fffffffffffffd90), (bVar1 & 1) != 0)) {
      local_228 = local_18;
      local_230._M_current =
           (example **)
           std::vector<example_*,_std::allocator<example_*>_>::begin(in_stack_fffffffffffffd88);
      std::vector<example_*,_std::allocator<example_*>_>::end(in_stack_fffffffffffffd88);
      while (bVar2 = __gnu_cxx::operator!=
                               (in_stack_fffffffffffffd90,
                                (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                 *)in_stack_fffffffffffffd88), bVar2) {
        __gnu_cxx::
        __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
        operator*(&local_230);
        LabelDict::del_example_namespaces_from_example
                  (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        __gnu_cxx::
        __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
        operator++(&local_230);
      }
      __a = &this->pred;
      ppeVar5 = std::vector<example_*,_std::allocator<example_*>_>::operator[]
                          ((vector<example_*,_std::allocator<example_*>_> *)local_18,0);
      std::swap<polyprediction>(__a,&(*ppeVar5)->pred);
      std::vector<example_*,_std::allocator<example_*>_>::begin
                ((vector<example_*,_std::allocator<example_*>_> *)&__a->scalars);
      __gnu_cxx::__normal_iterator<example*const*,std::vector<example*,std::allocator<example*>>>::
      __normal_iterator<example**>
                ((__normal_iterator<example_*const_*,_std::vector<example_*,_std::allocator<example_*>_>_>
                  *)local_18,
                 (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                  *)&__a->scalars);
      __position._M_current._7_1_ = in_stack_fffffffffffffe2f;
      __position._M_current._0_7_ = in_stack_fffffffffffffe28;
      std::vector<example_*,_std::allocator<example_*>_>::insert
                ((vector<example_*,_std::allocator<example_*>_> *)this,__position,
                 (value_type *)CONCAT17(bVar1,in_stack_fffffffffffffe18));
    }
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1a0);
  plineNumber = (int)((ulong)in_stack_fffffffffffffdb0 >> 0x20);
  std::operator<<(&local_190,
                  "cb_adf: At least one action must be provided for an example to be valid.");
  uVar4 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  vw_exception::vw_exception
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,plineNumber,
             (string *)in_stack_fffffffffffffda8._M_current);
  __cxa_throw(uVar4,&vw_exception::typeinfo,vw_exception::~vw_exception);
}

Assistant:

void predict_or_learn(sfm_data& , LEARNER::multi_learner& base, multi_ex& ec_seq)
{
  if (ec_seq.size() == 0)
    THROW("cb_adf: At least one action must be provided for an example to be valid.");

  multi_ex::value_type shared_example = nullptr;

  const bool has_example_header = CB::ec_is_example_header(*ec_seq[0]);
  if (has_example_header)
  {
    shared_example = ec_seq[0];
    ec_seq.erase(ec_seq.begin());
    // merge sequences
    for (auto & example : ec_seq) LabelDict::add_example_namespaces_from_example(*example, *shared_example);
    swap(ec_seq[0]->pred, shared_example->pred);
  }
  if (ec_seq.size() == 0)
    return;
  if (is_learn)
    base.learn(ec_seq);
  else
    base.predict(ec_seq);

  if (has_example_header)
  {
    for (auto& example : ec_seq) LabelDict::del_example_namespaces_from_example(*example, *shared_example);
    swap(shared_example->pred, ec_seq[0]->pred);
    ec_seq.insert(ec_seq.begin(), shared_example);
  }
}